

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O3

RealType __thiscall
OpenMD::ZConstraintForceModifier::getZTargetPos(ZConstraintForceModifier *this,int index)

{
  int iVar1;
  SimInfo *pSVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  RealType zTargetPos;
  Vector3d com;
  RealType local_30;
  Vector3d local_28;
  
  pSVar2 = (this->super_ForceModifier).info_;
  iVar1 = (pSVar2->molToProcMap_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[index];
  if (iVar1 == worldRank) {
    p_Var4 = (pSVar2->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var3 = &(pSVar2->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      if (index <= (int)p_Var4[1]._M_color) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < index];
    } while (p_Var4 != (_Base_ptr)0x0);
    Molecule::getCom(&local_28,(Molecule *)p_Var3[1]._M_parent);
    local_30 = local_28.super_Vector<double,_3U>.data_[2];
  }
  MPI_Bcast(&local_30,1,&ompi_mpi_double,iVar1,&ompi_mpi_comm_world);
  return local_30;
}

Assistant:

RealType ZConstraintForceModifier::getZTargetPos(int index) {
    RealType zTargetPos;
#ifndef IS_MPI
    Molecule* mol = info_->getMoleculeByGlobalIndex(index);
    assert(mol);
    Vector3d com = mol->getCom();
    zTargetPos   = com[whichDirection];
#else
    int whichProc = info_->getMolToProc(index);
    if (whichProc == worldRank) {
      Molecule* mol = info_->getMoleculeByGlobalIndex(index);
      Vector3d com  = mol->getCom();
      zTargetPos    = com[whichDirection];
      MPI_Bcast(&zTargetPos, 1, MPI_REALTYPE, whichProc, MPI_COMM_WORLD);
    } else {
      MPI_Bcast(&zTargetPos, 1, MPI_REALTYPE, whichProc, MPI_COMM_WORLD);
    }
#endif
    return zTargetPos;
  }